

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O0

void Psr_ManBuildNtk(Bac_Ntk_t *pNew,Vec_Ptr_t *vDes,Psr_Ntk_t *pNtk,Vec_Int_t *vMap,
                    Vec_Int_t *vBoxes)

{
  Bac_Man_t *p;
  int iVar1;
  uint uVar2;
  Bac_ObjType_t Type;
  int iVar3;
  int iVar4;
  Bac_Ntk_t *p_00;
  Psr_Ntk_t *pPVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  uint local_64;
  int local_60;
  int nNonDriven;
  int iNonDriven;
  int iTerm;
  int iConst0;
  int iObj;
  int NameId;
  int Index;
  int i;
  int iBox;
  Vec_Int_t *vSigs;
  Psr_Ntk_t *pNtkBox;
  Vec_Int_t *vBoxes_local;
  Vec_Int_t *vMap_local;
  Psr_Ntk_t *pNtk_local;
  Vec_Ptr_t *vDes_local;
  Bac_Ntk_t *pNew_local;
  
  local_60 = -1;
  local_64 = 0;
  iVar1 = Psr_NtkPioNum(pNtk);
  if (iVar1 != 0) {
    __assert_fail("Psr_NtkPioNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrsBuild.c"
                  ,0xa2,
                  "void Psr_ManBuildNtk(Bac_Ntk_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Psr_ManRemapBoxes(pNew->pDesign,vDes,pNtk,vMap);
  Bac_NtkStartNames(pNew);
  NameId = 0;
  while( true ) {
    iVar1 = Psr_NtkPiNum(pNtk);
    bVar8 = false;
    if (NameId < iVar1) {
      iConst0 = Vec_IntEntry(&pNtk->vInputs,NameId);
      bVar8 = iConst0 != 0;
    }
    if (!bVar8) break;
    iVar1 = Vec_IntEntry(vMap,iConst0);
    if (iVar1 != -1) {
      uVar2 = Vec_IntEntry(vMap,iConst0);
      printf("Primary inputs %d and %d have the same name.\n",(ulong)uVar2,(ulong)(uint)NameId);
    }
    iVar1 = Bac_ObjAlloc(pNew,BAC_OBJ_PI,-1);
    iVar3 = Abc_Var2Lit2(iConst0,0);
    Bac_ObjSetName(pNew,iVar1,iVar3);
    Vec_IntWriteEntry(vMap,iConst0,iVar1);
    NameId = NameId + 1;
  }
  Vec_IntClear(vBoxes);
  Index = 0;
  while( true ) {
    iVar1 = Psr_NtkBoxNum(pNtk);
    bVar8 = false;
    if (Index < iVar1) {
      _i = Psr_BoxSignals(pNtk,Index);
      bVar8 = _i != (Vec_Int_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Psr_BoxIsNode(pNtk,Index);
    if (iVar1 == 0) {
      iVar1 = Psr_BoxNtk(pNtk,Index);
      pPVar5 = Psr_ManNtk(vDes,iVar1 + -1);
      if (pPVar5 == (Psr_Ntk_t *)0x0) {
        iVar1 = Vec_IntSize(_i);
        iVar3 = Psr_BoxNtk(pNtk,Index);
        iTerm = Bac_BoxAlloc(pNew,BAC_BOX_GATE,iVar1 / 2 + -1,1,iVar3);
        iVar1 = Psr_BoxName(pNtk,Index);
        iVar1 = Abc_Var2Lit2(iVar1,0);
        Bac_ObjSetName(pNew,iTerm,iVar1);
        iVar1 = Vec_IntEntryLast(_i);
        iConst0 = Psr_NtkSigName(pNtk,iVar1);
        iVar1 = Vec_IntEntry(vMap,iConst0);
        if (iVar1 != -1) {
          printf("Box output name %d is already driven.\n",(ulong)(uint)iConst0);
        }
        iVar1 = Bac_BoxBo(pNew,iTerm,0);
        iVar3 = Abc_Var2Lit2(iConst0,0);
        Bac_ObjSetName(pNew,iVar1,iVar3);
        Vec_IntWriteEntry(vMap,iConst0,iVar1);
      }
      else {
        iVar1 = Psr_NtkPiNum(pPVar5);
        iVar3 = Psr_NtkPoNum(pPVar5);
        iVar4 = Psr_BoxNtk(pNtk,Index);
        iTerm = Bac_BoxAlloc(pNew,BAC_OBJ_BOX,iVar1,iVar3,iVar4);
        iVar1 = Psr_BoxName(pNtk,Index);
        iVar1 = Abc_Var2Lit2(iVar1,0);
        Bac_ObjSetName(pNew,iTerm,iVar1);
        p = pNew->pDesign;
        iVar1 = Psr_BoxNtk(pNtk,Index);
        p_00 = Bac_ManNtk(p,iVar1);
        iVar1 = Bac_NtkId(pNew);
        Bac_NtkSetHost(p_00,iVar1,iTerm);
        for (NameId = 0; iVar1 = Vec_IntSize(_i), NameId < iVar1; NameId = NameId + 2) {
          iVar1 = Vec_IntEntry(_i,NameId);
          iVar1 = iVar1 + -1;
          iVar3 = Psr_NtkPiNum(pPVar5);
          if (iVar3 <= iVar1) {
            iVar3 = Psr_NtkPiNum(pPVar5);
            iVar4 = Psr_NtkPoNum(pPVar5);
            if (iVar4 <= iVar1 - iVar3) {
              __assert_fail("Index - Psr_NtkPiNum(pNtkBox) < Psr_NtkPoNum(pNtkBox)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrsBuild.c"
                            ,0xcb,
                            "void Psr_ManBuildNtk(Bac_Ntk_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            iVar3 = Vec_IntEntry(_i,NameId + 1);
            iConst0 = Psr_NtkSigName(pNtk,iVar3);
            iVar3 = Vec_IntEntry(vMap,iConst0);
            if (iVar3 != -1) {
              printf("Box output name %d is already driven.\n",(ulong)(uint)iConst0);
            }
            iVar3 = Psr_NtkPiNum(pPVar5);
            iVar1 = Bac_BoxBo(pNew,iTerm,iVar1 - iVar3);
            iVar3 = Abc_Var2Lit2(iConst0,0);
            Bac_ObjSetName(pNew,iVar1,iVar3);
            Vec_IntWriteEntry(vMap,iConst0,iVar1);
          }
        }
      }
      Vec_IntPush(vBoxes,iTerm);
    }
    else {
      Type = Psr_BoxNtk(pNtk,Index);
      iVar1 = Psr_BoxIONum(pNtk,Index);
      iVar1 = Bac_BoxAlloc(pNew,Type,iVar1 + -1,1,-1);
      iVar3 = Vec_IntEntryLast(_i);
      iConst0 = Psr_NtkSigName(pNtk,iVar3);
      iVar3 = Vec_IntEntry(vMap,iConst0);
      if (iVar3 != -1) {
        printf("Node output name %d is already driven.\n",(ulong)(uint)iConst0);
      }
      iVar3 = Bac_BoxBo(pNew,iVar1,0);
      iVar4 = Abc_Var2Lit2(iConst0,0);
      Bac_ObjSetName(pNew,iVar3,iVar4);
      Vec_IntWriteEntry(vMap,iConst0,iVar3);
      Vec_IntPush(vBoxes,iVar1);
    }
    Index = Index + 1;
  }
  Index = 0;
  while( true ) {
    iVar1 = Psr_NtkBoxNum(pNtk);
    bVar8 = false;
    if (Index < iVar1) {
      _i = Psr_BoxSignals(pNtk,Index);
      bVar8 = _i != (Vec_Int_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Psr_BoxIsNode(pNtk,Index);
    if (iVar1 == 0) {
      iVar1 = Psr_BoxNtk(pNtk,Index);
      pPVar5 = Psr_ManNtk(vDes,iVar1 + -1);
      iVar1 = Vec_IntEntry(vBoxes,Index);
      if (pPVar5 == (Psr_Ntk_t *)0x0) {
        for (NameId = 0; iVar3 = Vec_IntSize(_i), NameId < iVar3 + -2; NameId = NameId + 2) {
          Vec_IntEntry(_i,NameId);
          iVar3 = Vec_IntEntry(_i,NameId + 1);
          iConst0 = Psr_NtkSigName(pNtk,iVar3);
          iVar3 = Bac_BoxBi(pNew,iVar1,(NameId + 1) / 2);
          iVar4 = Vec_IntEntry(vMap,iConst0);
          if (iVar4 == -1) {
            iVar4 = Bac_BoxAlloc(pNew,BAC_BOX_CF,0,1,-1);
            Vec_IntWriteEntry(vMap,iConst0,iVar4 + 1);
            if (local_60 == -1) {
              local_60 = iConst0;
            }
            local_64 = local_64 + 1;
          }
          iVar4 = Vec_IntEntry(vMap,iConst0);
          Bac_ObjSetFanin(pNew,iVar3,iVar4);
        }
      }
      else {
        for (NameId = 0; iVar3 = Vec_IntSize(_i), NameId < iVar3; NameId = NameId + 2) {
          iVar3 = Vec_IntEntry(_i,NameId);
          iVar4 = Psr_NtkPiNum(pPVar5);
          if (iVar3 + -1 < iVar4) {
            iVar4 = Vec_IntEntry(_i,NameId + 1);
            iConst0 = Psr_NtkSigName(pNtk,iVar4);
            iVar3 = Bac_BoxBi(pNew,iVar1,iVar3 + -1);
            iVar4 = Vec_IntEntry(vMap,iConst0);
            if (iVar4 == -1) {
              iVar4 = Bac_BoxAlloc(pNew,BAC_BOX_CF,0,1,-1);
              Vec_IntWriteEntry(vMap,iConst0,iVar4 + 1);
              if (local_60 == -1) {
                local_60 = iConst0;
              }
              local_64 = local_64 + 1;
            }
            iVar4 = Vec_IntEntry(vMap,iConst0);
            Bac_ObjSetFanin(pNew,iVar3,iVar4);
          }
        }
      }
    }
    else {
      iVar1 = Vec_IntEntry(vBoxes,Index);
      for (NameId = 0; iVar3 = Vec_IntSize(_i), NameId < iVar3 + -2; NameId = NameId + 2) {
        Vec_IntEntry(_i,NameId);
        iVar3 = Vec_IntEntry(_i,NameId + 1);
        iConst0 = Psr_NtkSigName(pNtk,iVar3);
        iVar3 = Bac_BoxBi(pNew,iVar1,(NameId + 1) / 2);
        iVar4 = Vec_IntEntry(vMap,iConst0);
        if (iVar4 == -1) {
          iVar4 = Bac_BoxAlloc(pNew,BAC_BOX_CF,0,1,-1);
          Vec_IntWriteEntry(vMap,iConst0,iVar4 + 1);
          if (local_60 == -1) {
            local_60 = iConst0;
          }
          local_64 = local_64 + 1;
        }
        iVar4 = Vec_IntEntry(vMap,iConst0);
        Bac_ObjSetFanin(pNew,iVar3,iVar4);
      }
    }
    Index = Index + 1;
  }
  NameId = 0;
  while( true ) {
    iVar1 = Psr_NtkPoNum(pNtk);
    bVar8 = false;
    if (NameId < iVar1) {
      iConst0 = Vec_IntEntry(&pNtk->vOutputs,NameId);
      bVar8 = iConst0 != 0;
    }
    if (!bVar8) break;
    iVar1 = Vec_IntEntry(vMap,iConst0);
    if (iVar1 == -1) {
      iVar1 = Bac_BoxAlloc(pNew,BAC_BOX_CF,0,1,-1);
      Vec_IntWriteEntry(vMap,iConst0,iVar1 + 1);
      if (local_60 == -1) {
        local_60 = iConst0;
      }
      local_64 = local_64 + 1;
    }
    NameId = NameId + 1;
  }
  NameId = 0;
  while( true ) {
    iVar1 = Psr_NtkPoNum(pNtk);
    bVar8 = false;
    if (NameId < iVar1) {
      iConst0 = Vec_IntEntry(&pNtk->vOutputs,NameId);
      bVar8 = iConst0 != 0;
    }
    if (!bVar8) break;
    iVar1 = Vec_IntEntry(vMap,iConst0);
    Bac_ObjAlloc(pNew,BAC_OBJ_PO,iVar1);
    NameId = NameId + 1;
  }
  if (local_64 != 0) {
    pcVar6 = Psr_NtkName(pNtk);
    pcVar7 = Psr_NtkStr(pNtk,local_60);
    printf("Module %s has %d non-driven nets (for example, %s).\n",pcVar6,(ulong)local_64,pcVar7);
  }
  Psr_ManCleanMap(pNtk,vMap);
  for (NameId = 0; iVar1 = Vec_IntSize(&pNtk->vOrder), NameId < iVar1; NameId = NameId + 1) {
    iVar1 = Vec_IntEntry(&pNtk->vOrder,NameId);
    Bac_NtkAddInfo(pNew,iVar1,-1,-1);
  }
  return;
}

Assistant:

void Psr_ManBuildNtk( Bac_Ntk_t * pNew, Vec_Ptr_t * vDes, Psr_Ntk_t * pNtk, Vec_Int_t * vMap, Vec_Int_t * vBoxes )
{
    Psr_Ntk_t * pNtkBox; Vec_Int_t * vSigs; int iBox;
    int i, Index, NameId, iObj, iConst0, iTerm;
    int iNonDriven = -1, nNonDriven = 0;
    assert( Psr_NtkPioNum(pNtk) == 0 );
    Psr_ManRemapBoxes( pNew->pDesign, vDes, pNtk, vMap );
    Bac_NtkStartNames( pNew );
    // create primary inputs 
    Psr_NtkForEachPi( pNtk, NameId, i )
    {
        if ( Vec_IntEntry(vMap, NameId) != -1 )
            printf( "Primary inputs %d and %d have the same name.\n", Vec_IntEntry(vMap, NameId), i );
        iObj = Bac_ObjAlloc( pNew, BAC_OBJ_PI, -1 );
        Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
        Vec_IntWriteEntry( vMap, NameId, iObj );
    }
    // create box outputs
    Vec_IntClear( vBoxes );
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            pNtkBox = Psr_ManNtk( vDes, Psr_BoxNtk(pNtk, iBox)-1 );
            if ( pNtkBox == NULL )
            {
                iObj = Bac_BoxAlloc( pNew, BAC_BOX_GATE, Vec_IntSize(vSigs)/2-1, 1, Psr_BoxNtk(pNtk, iBox) );
                Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(Psr_BoxName(pNtk, iBox), BAC_NAME_BIN) );
                // consider box output 
                NameId = Vec_IntEntryLast( vSigs );
                NameId = Psr_NtkSigName( pNtk, NameId );
                if ( Vec_IntEntry(vMap, NameId) != -1 )
                    printf( "Box output name %d is already driven.\n", NameId );
                iTerm = Bac_BoxBo( pNew, iObj, 0 );
                Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
                Vec_IntWriteEntry( vMap, NameId, iTerm );
            }
            else
            {
                iObj = Bac_BoxAlloc( pNew, BAC_OBJ_BOX, Psr_NtkPiNum(pNtkBox), Psr_NtkPoNum(pNtkBox), Psr_BoxNtk(pNtk, iBox) );
                Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(Psr_BoxName(pNtk, iBox), BAC_NAME_BIN) );
                Bac_NtkSetHost( Bac_ManNtk(pNew->pDesign, Psr_BoxNtk(pNtk, iBox)), Bac_NtkId(pNew), iObj );
                Vec_IntForEachEntry( vSigs, Index, i )
                {
                    i++;
                    if ( --Index < Psr_NtkPiNum(pNtkBox) )
                        continue;
                    assert( Index - Psr_NtkPiNum(pNtkBox) < Psr_NtkPoNum(pNtkBox) );
                    // consider box output 
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    if ( Vec_IntEntry(vMap, NameId) != -1 )
                        printf( "Box output name %d is already driven.\n", NameId );
                    iTerm = Bac_BoxBo( pNew, iObj, Index - Psr_NtkPiNum(pNtkBox) );
                    Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
                    Vec_IntWriteEntry( vMap, NameId, iTerm );
                }
            }
            // remember box
            Vec_IntPush( vBoxes, iObj );
        }
        else
        {
            iObj = Bac_BoxAlloc( pNew, (Bac_ObjType_t)Psr_BoxNtk(pNtk, iBox), Psr_BoxIONum(pNtk, iBox)-1, 1, -1 );
            // consider box output 
            NameId = Vec_IntEntryLast( vSigs );
            NameId = Psr_NtkSigName( pNtk, NameId );
            if ( Vec_IntEntry(vMap, NameId) != -1 )
                printf( "Node output name %d is already driven.\n", NameId );
            iTerm = Bac_BoxBo( pNew, iObj, 0 );
            Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
            Vec_IntWriteEntry( vMap, NameId, iTerm );
            // remember box
            Vec_IntPush( vBoxes, iObj );
        }
    // add fanins for box inputs
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            pNtkBox = Psr_ManNtk( vDes, Psr_BoxNtk(pNtk, iBox)-1 );
            iObj = Vec_IntEntry( vBoxes, iBox );
            if ( pNtkBox == NULL )
            {
                Vec_IntForEachEntryStop( vSigs, Index, i, Vec_IntSize(vSigs)-2 )
                {
                    i++;
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    iTerm = Bac_BoxBi( pNew, iObj, i/2 );
                    if ( Vec_IntEntry(vMap, NameId) == -1 )
                    {
                        iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                        Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                        if ( iNonDriven == -1 )
                            iNonDriven = NameId;
                        nNonDriven++;
                    }
                    Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
                }
            }
            else
            {
                Vec_IntForEachEntry( vSigs, Index, i )
                {
                    i++;
                    if ( --Index >= Psr_NtkPiNum(pNtkBox) )
                        continue;
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    iTerm = Bac_BoxBi( pNew, iObj, Index );
                    if ( Vec_IntEntry(vMap, NameId) == -1 )
                    {
                        iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                        Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                        if ( iNonDriven == -1 )
                            iNonDriven = NameId;
                        nNonDriven++;
                    }
                    Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
                }
            }
        }
        else
        {
            iObj = Vec_IntEntry( vBoxes, iBox );
            Vec_IntForEachEntryStop( vSigs, Index, i, Vec_IntSize(vSigs)-2 )
            {
                NameId = Vec_IntEntry( vSigs, ++i );
                NameId = Psr_NtkSigName( pNtk, NameId );
                iTerm = Bac_BoxBi( pNew, iObj, i/2 );
                if ( Vec_IntEntry(vMap, NameId) == -1 )
                {
                    iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                    Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                    if ( iNonDriven == -1 )
                        iNonDriven = NameId;
                    nNonDriven++;
                }
                Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
            }
        }
    // add fanins for primary outputs
    Psr_NtkForEachPo( pNtk, NameId, i )
        if ( Vec_IntEntry(vMap, NameId) == -1 )
        {
            iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
            Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
            if ( iNonDriven == -1 )
                iNonDriven = NameId;
            nNonDriven++;
        }
    Psr_NtkForEachPo( pNtk, NameId, i )
        iObj = Bac_ObjAlloc( pNew, BAC_OBJ_PO, Vec_IntEntry(vMap, NameId) );
    if ( nNonDriven )
        printf( "Module %s has %d non-driven nets (for example, %s).\n", Psr_NtkName(pNtk), nNonDriven, Psr_NtkStr(pNtk, iNonDriven) );
    Psr_ManCleanMap( pNtk, vMap );
    // setup info
    Vec_IntForEachEntry( &pNtk->vOrder, NameId, i )
        Bac_NtkAddInfo( pNew, NameId, -1, -1 );
}